

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicToricLattice.cpp
# Opt level: O2

int __thiscall
RhombicToricLattice::neighbour(RhombicToricLattice *this,int vertexIndex,string *direction,int sign)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  cartesian4 cVar9;
  string *__lhs;
  bool bVar10;
  int iVar11;
  invalid_argument *this_00;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  cartesian4 cVar17;
  cartesian4 local_50;
  int local_3c;
  string *local_38;
  undefined1 auVar5 [12];
  
  local_38 = direction;
  if ((sign != -1) && (sign != 1)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Sign must be either 1 or -1.");
LAB_0011f25d:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_3c = sign;
  bVar10 = std::operator==(direction,"xy");
  if ((((!bVar10) && (bVar10 = std::operator==(direction,"xz"), !bVar10)) &&
      (bVar10 = std::operator==(direction,"yz"), !bVar10)) &&
     (bVar10 = std::operator==(direction,"xyz"), !bVar10)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
    goto LAB_0011f25d;
  }
  cVar17 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  auVar5 = cVar17._0_12_;
  iVar14 = cVar17.y;
  local_50 = cVar17;
  bVar10 = std::operator==(direction,"xy");
  __lhs = local_38;
  iVar11 = local_3c;
  iVar12 = local_3c >> 0x1f;
  if (cVar17.w == 1) {
    if (bVar10) {
      iVar15 = (this->super_Lattice).l;
      uVar2 = (long)(int)(cVar17.x + (uint)(0 < local_3c)) % (long)iVar15;
      iVar14 = (int)(iVar14 + (uint)(0 < local_3c)) % iVar15;
      local_50.y = iVar14;
      local_50.x = (int)uVar2;
      uVar3 = (long)(cVar17.z - iVar12) % (long)iVar15;
      auVar4._8_8_ = uVar3 & 0xffffffff;
      auVar4._0_8_ = uVar2 & 0xffffffff;
      auVar5 = auVar4._0_12_;
      local_50.z = (int)uVar3;
      local_50.w = 0;
    }
    bVar10 = std::operator==(local_38,"xz");
    cVar17 = local_50;
    if (bVar10) {
      iVar15 = (this->super_Lattice).l;
      uVar2 = (long)(int)(auVar5._0_4_ + (uint)(0 < iVar11)) % (long)iVar15;
      iVar16 = (int)uVar2;
      local_50.x = iVar16;
      cVar9 = local_50;
      uVar3 = (long)(int)(auVar5._8_4_ + (uint)(0 < iVar11)) % (long)iVar15;
      auVar6._8_8_ = uVar3 & 0xffffffff;
      auVar6._0_8_ = uVar2 & 0xffffffff;
      auVar5 = auVar6._0_12_;
      local_50.w = cVar17.w;
      local_50._0_8_ = cVar9._0_8_;
      local_50.z = (int)uVar3;
      iVar14 = (iVar14 - iVar12) % iVar15;
      local_50.y = iVar14;
      local_50.w = 0;
    }
    iVar15 = auVar5._8_4_;
    iVar16 = auVar5._0_4_;
    bVar10 = std::operator==(__lhs,"yz");
    cVar17 = local_50;
    if (bVar10) {
      iVar1 = (this->super_Lattice).l;
      iVar14 = (int)(iVar14 + (uint)(0 < iVar11)) % iVar1;
      auVar8._4_4_ = local_50.z;
      auVar8._8_4_ = local_50.w;
      auVar8._0_4_ = iVar14;
      local_50._0_8_ = auVar8._0_8_ << 0x20;
      iVar15 = (int)(iVar15 + (uint)(0 < iVar11)) % iVar1;
      local_50.w = cVar17.w;
      local_50.z = iVar15;
      iVar16 = (iVar16 - iVar12) % iVar1;
      local_50.x = iVar16;
      local_50.w = 0;
    }
    bVar10 = std::operator==(__lhs,"xyz");
    if (!bVar10) goto LAB_0011f227;
    uVar13 = (uint)(0 < iVar11);
    local_50.z = (this->super_Lattice).l;
    local_50.y = (int)(iVar14 + uVar13) % local_50.z;
    local_50.x = (int)(iVar16 + uVar13) % local_50.z;
    local_50.z = (int)(iVar15 + uVar13) % local_50.z;
    local_50.w = 0;
  }
  else {
    if (bVar10) {
      iVar15 = (this->super_Lattice).l;
      uVar2 = (long)(cVar17.x + iVar12 + iVar15) % (long)iVar15;
      iVar14 = (iVar12 + iVar14 + iVar15) % iVar15;
      local_50.y = iVar14;
      local_50.x = (int)uVar2;
      uVar3 = (long)(int)((iVar15 - (uint)(0 < local_3c)) + cVar17.z) % (long)iVar15;
      auVar7._8_8_ = uVar3 & 0xffffffff;
      auVar7._0_8_ = uVar2 & 0xffffffff;
      auVar5 = auVar7._0_12_;
      local_50.z = (int)uVar3;
      local_50.w = 1;
    }
    iVar15 = auVar5._8_4_;
    iVar16 = auVar5._0_4_;
    bVar10 = std::operator==(local_38,"xz");
    cVar17 = local_50;
    if (bVar10) {
      iVar1 = (this->super_Lattice).l;
      iVar16 = (iVar16 + iVar12 + iVar1) % iVar1;
      local_50.x = iVar16;
      cVar9 = local_50;
      iVar15 = (iVar12 + iVar15 + iVar1) % iVar1;
      local_50.w = cVar17.w;
      local_50._0_8_ = cVar9._0_8_;
      local_50.z = iVar15;
      iVar14 = (int)((iVar1 - (uint)(0 < iVar11)) + iVar14) % iVar1;
      local_50.y = iVar14;
      local_50.w = 1;
    }
    bVar10 = std::operator==(__lhs,"yz");
    cVar17 = local_50;
    if (bVar10) {
      iVar1 = (this->super_Lattice).l;
      iVar14 = (iVar14 + iVar12 + iVar1) % iVar1;
      auVar5._4_4_ = local_50.z;
      auVar5._8_4_ = local_50.w;
      auVar5._0_4_ = iVar14;
      local_50._0_8_ = auVar5._0_8_ << 0x20;
      iVar15 = (iVar12 + iVar15 + iVar1) % iVar1;
      local_50.w = cVar17.w;
      local_50.z = iVar15;
      iVar16 = (int)((iVar1 - (uint)(0 < iVar11)) + iVar16) % iVar1;
      local_50.x = iVar16;
      local_50.w = 1;
    }
    bVar10 = std::operator==(__lhs,"xyz");
    if (!bVar10) goto LAB_0011f227;
    local_50.z = (this->super_Lattice).l;
    local_50.y = (iVar14 + iVar12 + local_50.z) % local_50.z;
    local_50.x = (iVar16 + iVar12 + local_50.z) % local_50.z;
    local_50.z = (iVar12 + local_50.z + iVar15) % local_50.z;
    local_50.w = 1;
  }
LAB_0011f227:
  iVar11 = Lattice::coordinateToIndex(&this->super_Lattice,&local_50);
  return iVar11;
}

Assistant:

int RhombicToricLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    // if (direction == "x")
    //     coordinate.x = (coordinate.x + sign + l) % l;
    // if (direction == "y")
    //     coordinate.y = (coordinate.y + sign + l) % l;
    // if (direction == "z")
    //     coordinate.z = (coordinate.z + sign + l) % l;
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.x = (coordinate.x + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.x = (coordinate.x - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.w = 1;
        }
    }
    return coordinateToIndex(coordinate);
}